

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall
TldAddressAsKey::TldAddressAsKey
          (TldAddressAsKey *this,uint8_t *addr,size_t addr_len,uint8_t *tld,size_t tld_len,
          my_bpftimeval ts,int is_nx,DnsStatsLeakType leakType,int flags)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t uVar4;
  size_t __n;
  
  this->HashNext = (TldAddressAsKey *)0x0;
  this->count = 1;
  this->hash = 0;
  this->tld_min_delay = -1;
  this->is_nx = is_nx;
  this->leakType = leakType;
  this->flags = flags;
  __n = 0x10;
  if (addr_len < 0x10) {
    __n = addr_len;
  }
  memcpy(this->addr,addr,__n);
  this->addr_len = __n;
  (this->ts).tv_sec = ts.tv_sec;
  (this->ts).tv_usec = ts.tv_usec;
  (this->ts_init).tv_sec = ts.tv_sec;
  (this->ts_init).tv_usec = ts.tv_usec;
  sVar3 = 0x40;
  if (tld_len < 0x40) {
    sVar3 = tld_len;
  }
  sVar2 = 0;
  if (tld_len != 0) {
    do {
      uVar1 = tld[sVar2];
      uVar4 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar4 = uVar1;
      }
      this->tld[sVar2] = uVar4;
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
  }
  this->tld_len = sVar2;
  this->tld[sVar2] = '\0';
  return;
}

Assistant:

TldAddressAsKey::TldAddressAsKey(uint8_t * addr, size_t addr_len, uint8_t * tld, size_t tld_len, my_bpftimeval ts, int is_nx, DnsStatsLeakType leakType, int flags)
    :
    HashNext(NULL),
    count(1),
    hash(0),
    tld_min_delay(-1),
    is_nx(is_nx),
    leakType(leakType),
    flags(flags)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;

    this->ts.tv_sec = ts.tv_sec;
    this->ts.tv_usec = ts.tv_usec;

    this->ts_init.tv_sec = ts.tv_sec;
    this->ts_init.tv_usec = ts.tv_usec;

    TldAsKey::CanonicCopy(this->tld, sizeof(this->tld) - 1, &this->tld_len, tld, tld_len);
}